

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O1

void png_read_filter_row_paeth_1byte_pixel
               (png_row_infop row_info,png_bytep row,png_const_bytep prev_row)

{
  byte bVar1;
  png_size_t pVar2;
  uint uVar3;
  uint uVar4;
  byte *pbVar5;
  uint uVar6;
  byte *pbVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  pVar2 = row_info->rowbytes;
  bVar1 = *prev_row;
  uVar8 = (uint)*row + (uint)bVar1;
  *row = (png_byte)uVar8;
  if (1 < (long)pVar2) {
    pbVar7 = row + 1;
    pbVar5 = prev_row + 1;
    do {
      uVar4 = (uint)bVar1;
      bVar1 = *pbVar5;
      uVar10 = bVar1 - uVar4;
      uVar6 = (uVar8 & 0xff) - uVar4;
      uVar3 = -uVar10;
      if (0 < (int)uVar10) {
        uVar3 = uVar10;
      }
      uVar9 = -uVar6;
      if (0 < (int)uVar6) {
        uVar9 = uVar6;
      }
      uVar6 = uVar6 + uVar10;
      uVar10 = -uVar6;
      if (0 < (int)uVar6) {
        uVar10 = uVar6;
      }
      uVar6 = (uint)bVar1;
      if (uVar3 <= uVar9) {
        uVar6 = uVar8 & 0xff;
        uVar9 = uVar3;
      }
      if (uVar9 <= uVar10) {
        uVar4 = uVar6;
      }
      uVar8 = *pbVar7 + uVar4;
      *pbVar7 = (byte)uVar8;
      pbVar7 = pbVar7 + 1;
      pbVar5 = pbVar5 + 1;
    } while (pbVar7 < row + pVar2);
  }
  return;
}

Assistant:

static void
png_read_filter_row_paeth_1byte_pixel(png_row_infop row_info, png_bytep row,
    png_const_bytep prev_row)
{
   png_bytep rp_end = row + row_info->rowbytes;
   int a, c;

   /* First pixel/byte */
   c = *prev_row++;
   a = *row + c;
   *row++ = (png_byte)a;

   /* Remainder */
   while (row < rp_end)
   {
      int b, pa, pb, pc, p;

      a &= 0xff; /* From previous iteration or start */
      b = *prev_row++;

      p = b - c;
      pc = a - c;

#ifdef PNG_USE_ABS
      pa = abs(p);
      pb = abs(pc);
      pc = abs(p + pc);
#else
      pa = p < 0 ? -p : p;
      pb = pc < 0 ? -pc : pc;
      pc = (p + pc) < 0 ? -(p + pc) : p + pc;
#endif

      /* Find the best predictor, the least of pa, pb, pc favoring the earlier
       * ones in the case of a tie.
       */
      if (pb < pa)
      {
         pa = pb; a = b;
      }
      if (pc < pa) a = c;

      /* Calculate the current pixel in a, and move the previous row pixel to c
       * for the next time round the loop
       */
      c = b;
      a += *row;
      *row++ = (png_byte)a;
   }
}